

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Crypto.cpp
# Opt level: O1

bool __thiscall SRUP_Crypto::VerifyF(SRUP_Crypto *this,uchar *data,size_t datasize,char *keyfile)

{
  int iVar1;
  RSA *siglen;
  uchar *in_R8;
  size_t in_R9;
  
  siglen = getPubKeyF(keyfile);
  if (siglen != (RSA *)0x0) {
    iVar1 = _verify(this,(EVP_PKEY_CTX *)data,(uchar *)datasize,(size_t)siglen,in_R8,in_R9);
    return SUB41(iVar1,0);
  }
  return false;
}

Assistant:

bool SRUP_Crypto::VerifyF(unsigned char *data, size_t datasize, char *keyfile)
{
    RSA* key;
    key = getPubKeyF(keyfile);
    if (key != nullptr)
        return _verify(data, datasize, key);
    else
        return false;
}